

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pce.c
# Opt level: O3

int pce_pack_16x16_sprite(uchar *buffer,void *data,int line_offset,int format)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  
  if (pass == 1) {
    buffer[0x70] = '\0';
    buffer[0x71] = '\0';
    buffer[0x72] = '\0';
    buffer[0x73] = '\0';
    buffer[0x74] = '\0';
    buffer[0x75] = '\0';
    buffer[0x76] = '\0';
    buffer[0x77] = '\0';
    buffer[0x78] = '\0';
    buffer[0x79] = '\0';
    buffer[0x7a] = '\0';
    buffer[0x7b] = '\0';
    buffer[0x7c] = '\0';
    buffer[0x7d] = '\0';
    buffer[0x7e] = '\0';
    buffer[0x7f] = '\0';
    buffer[0x60] = '\0';
    buffer[0x61] = '\0';
    buffer[0x62] = '\0';
    buffer[99] = '\0';
    buffer[100] = '\0';
    buffer[0x65] = '\0';
    buffer[0x66] = '\0';
    buffer[0x67] = '\0';
    buffer[0x68] = '\0';
    buffer[0x69] = '\0';
    buffer[0x6a] = '\0';
    buffer[0x6b] = '\0';
    buffer[0x6c] = '\0';
    buffer[0x6d] = '\0';
    buffer[0x6e] = '\0';
    buffer[0x6f] = '\0';
    buffer[0x50] = '\0';
    buffer[0x51] = '\0';
    buffer[0x52] = '\0';
    buffer[0x53] = '\0';
    buffer[0x54] = '\0';
    buffer[0x55] = '\0';
    buffer[0x56] = '\0';
    buffer[0x57] = '\0';
    buffer[0x58] = '\0';
    buffer[0x59] = '\0';
    buffer[0x5a] = '\0';
    buffer[0x5b] = '\0';
    buffer[0x5c] = '\0';
    buffer[0x5d] = '\0';
    buffer[0x5e] = '\0';
    buffer[0x5f] = '\0';
    buffer[0x40] = '\0';
    buffer[0x41] = '\0';
    buffer[0x42] = '\0';
    buffer[0x43] = '\0';
    buffer[0x44] = '\0';
    buffer[0x45] = '\0';
    buffer[0x46] = '\0';
    buffer[0x47] = '\0';
    buffer[0x48] = '\0';
    buffer[0x49] = '\0';
    buffer[0x4a] = '\0';
    buffer[0x4b] = '\0';
    buffer[0x4c] = '\0';
    buffer[0x4d] = '\0';
    buffer[0x4e] = '\0';
    buffer[0x4f] = '\0';
    buffer[0x30] = '\0';
    buffer[0x31] = '\0';
    buffer[0x32] = '\0';
    buffer[0x33] = '\0';
    buffer[0x34] = '\0';
    buffer[0x35] = '\0';
    buffer[0x36] = '\0';
    buffer[0x37] = '\0';
    buffer[0x38] = '\0';
    buffer[0x39] = '\0';
    buffer[0x3a] = '\0';
    buffer[0x3b] = '\0';
    buffer[0x3c] = '\0';
    buffer[0x3d] = '\0';
    buffer[0x3e] = '\0';
    buffer[0x3f] = '\0';
    buffer[0x20] = '\0';
    buffer[0x21] = '\0';
    buffer[0x22] = '\0';
    buffer[0x23] = '\0';
    buffer[0x24] = '\0';
    buffer[0x25] = '\0';
    buffer[0x26] = '\0';
    buffer[0x27] = '\0';
    buffer[0x28] = '\0';
    buffer[0x29] = '\0';
    buffer[0x2a] = '\0';
    buffer[0x2b] = '\0';
    buffer[0x2c] = '\0';
    buffer[0x2d] = '\0';
    buffer[0x2e] = '\0';
    buffer[0x2f] = '\0';
    buffer[0x10] = '\0';
    buffer[0x11] = '\0';
    buffer[0x12] = '\0';
    buffer[0x13] = '\0';
    buffer[0x14] = '\0';
    buffer[0x15] = '\0';
    buffer[0x16] = '\0';
    buffer[0x17] = '\0';
    buffer[0x18] = '\0';
    buffer[0x19] = '\0';
    buffer[0x1a] = '\0';
    buffer[0x1b] = '\0';
    buffer[0x1c] = '\0';
    buffer[0x1d] = '\0';
    buffer[0x1e] = '\0';
    buffer[0x1f] = '\0';
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    buffer[8] = '\0';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[0xc] = '\0';
    buffer[0xd] = '\0';
    buffer[0xe] = '\0';
    buffer[0xf] = '\0';
    if (format == 1) {
      uVar1 = 0;
      iVar3 = 0;
      do {
        bVar7 = buffer[uVar1];
        bVar8 = buffer[uVar1 + 0x20];
        bVar4 = buffer[uVar1 + 0x40];
        bVar5 = buffer[uVar1 + 0x60];
        uVar6 = 0;
        do {
          bVar11 = *(byte *)((long)data + ((ulong)uVar6 ^ 0xf));
          bVar10 = (byte)(1 << ((byte)uVar6 & 0x1f));
          bVar9 = bVar11 & 1;
          if ((bVar11 & 1) != 0) {
            bVar9 = bVar10;
          }
          bVar7 = bVar7 | bVar9;
          bVar9 = bVar11 & 2;
          if ((bVar11 & 2) != 0) {
            bVar9 = bVar10;
          }
          buffer[uVar1] = bVar7;
          bVar8 = bVar8 | bVar9;
          buffer[uVar1 + 0x20] = bVar8;
          bVar9 = bVar11 & 4;
          if ((bVar11 & 4) != 0) {
            bVar9 = bVar10;
          }
          bVar4 = bVar4 | bVar9;
          buffer[uVar1 + 0x40] = bVar4;
          bVar9 = bVar11 & 8;
          if ((bVar11 & 8) != 0) {
            bVar9 = bVar10;
          }
          bVar5 = bVar5 | bVar9;
          buffer[uVar1 + 0x60] = bVar5;
          uVar6 = uVar6 + 1;
        } while (uVar6 != 8);
        bVar7 = buffer[uVar1 + 1];
        bVar8 = buffer[uVar1 + 0x21];
        bVar4 = buffer[uVar1 + 0x41];
        bVar5 = buffer[uVar1 + 0x61];
        uVar6 = 0;
        do {
          bVar11 = *(byte *)((long)data + ((ulong)uVar6 ^ 7));
          bVar10 = (byte)(1 << ((byte)uVar6 & 0x1f));
          bVar9 = bVar11 & 1;
          if ((bVar11 & 1) != 0) {
            bVar9 = bVar10;
          }
          bVar7 = bVar7 | bVar9;
          bVar9 = bVar11 & 2;
          if ((bVar11 & 2) != 0) {
            bVar9 = bVar10;
          }
          buffer[uVar1 | 1] = bVar7;
          bVar8 = bVar8 | bVar9;
          buffer[uVar1 + 0x21] = bVar8;
          bVar9 = bVar11 & 4;
          if ((bVar11 & 4) != 0) {
            bVar9 = bVar10;
          }
          bVar4 = bVar4 | bVar9;
          buffer[uVar1 + 0x41] = bVar4;
          bVar9 = bVar11 & 8;
          if ((bVar11 & 8) != 0) {
            bVar9 = bVar10;
          }
          bVar5 = bVar5 | bVar9;
          buffer[uVar1 + 0x61] = bVar5;
          uVar6 = uVar6 + 1;
        } while (uVar6 != 8);
        data = (void *)((long)data + (long)line_offset);
        uVar1 = uVar1 + 2;
        iVar3 = iVar3 + 1;
      } while (iVar3 != 0x10);
    }
    else if (format == 2) {
      uVar1 = 0;
      iVar3 = 0;
      do {
        uVar6 = *(uint *)((long)data + uVar1 * 4);
        bVar7 = buffer[uVar1 + 1];
        bVar8 = buffer[uVar1 + 0x21];
        bVar4 = buffer[uVar1 + 0x41];
        bVar5 = buffer[uVar1 + 0x61];
        iVar2 = 0;
        do {
          bVar9 = (byte)(1 << ((byte)iVar2 & 0x1f));
          bVar11 = (byte)(uVar6 & 1);
          if ((uVar6 & 1) != 0) {
            bVar11 = bVar9;
          }
          bVar7 = bVar7 | bVar11;
          bVar11 = (byte)(uVar6 & 2);
          if ((uVar6 & 2) != 0) {
            bVar11 = bVar9;
          }
          bVar8 = bVar8 | bVar11;
          bVar11 = (byte)(uVar6 & 4);
          if ((uVar6 & 4) != 0) {
            bVar11 = bVar9;
          }
          bVar4 = bVar4 | bVar11;
          bVar11 = (byte)(uVar6 & 8);
          if ((uVar6 & 8) != 0) {
            bVar11 = bVar9;
          }
          bVar5 = bVar5 | bVar11;
          uVar6 = uVar6 >> 4;
          iVar2 = iVar2 + 1;
        } while (iVar2 != 8);
        buffer[uVar1 | 1] = bVar7;
        buffer[uVar1 + 0x21] = bVar8;
        buffer[uVar1 + 0x41] = bVar4;
        buffer[uVar1 + 0x61] = bVar5;
        uVar6 = *(uint *)((long)data + (uVar1 | 1) * 4);
        bVar7 = buffer[uVar1];
        bVar8 = buffer[uVar1 + 0x20];
        bVar4 = buffer[uVar1 + 0x40];
        bVar5 = buffer[uVar1 + 0x60];
        iVar2 = 0;
        do {
          bVar9 = (byte)(1 << ((byte)iVar2 & 0x1f));
          bVar11 = (byte)(uVar6 & 1);
          if ((uVar6 & 1) != 0) {
            bVar11 = bVar9;
          }
          bVar7 = bVar7 | bVar11;
          bVar11 = (byte)(uVar6 & 2);
          if ((uVar6 & 2) != 0) {
            bVar11 = bVar9;
          }
          bVar8 = bVar8 | bVar11;
          bVar11 = (byte)(uVar6 & 4);
          if ((uVar6 & 4) != 0) {
            bVar11 = bVar9;
          }
          bVar4 = bVar4 | bVar11;
          bVar11 = (byte)(uVar6 & 8);
          if ((uVar6 & 8) != 0) {
            bVar11 = bVar9;
          }
          bVar5 = bVar5 | bVar11;
          uVar6 = uVar6 >> 4;
          iVar2 = iVar2 + 1;
        } while (iVar2 != 8);
        buffer[uVar1] = bVar7;
        buffer[uVar1 + 0x20] = bVar8;
        buffer[uVar1 + 0x40] = bVar4;
        buffer[uVar1 + 0x60] = bVar5;
        uVar1 = uVar1 + 2;
        iVar3 = iVar3 + 1;
      } while (iVar3 != 0x10);
    }
    else {
      error("Internal error: unsupported format passed to \'pack_16x16_sprite\'!");
    }
  }
  return 0x80;
}

Assistant:

int
pce_pack_16x16_sprite(unsigned char *buffer, void *data, int line_offset, int format)
{
	int i, j;
	int cnt;
	unsigned int   pixel, mask;
	unsigned char *ptr;
	unsigned int  *packed;

	/* pack the sprite only in the last pass */
	if (pass != LAST_PASS)
		return (128);

	/* clear buffer */
	memset(buffer, 0, 128);

	/* encode the sprite */
	switch (format) {
	case CHUNKY_TILE:
		/* 8-bit chunky format - from pcx */
		cnt = 0;
		ptr = (unsigned char *)data;

		for (i = 0; i < 16; i++) {
			/* right column */
			for (j = 0; j < 8; j++) {
				pixel = ptr[j ^ 0x0F];
				mask  = 1 << j;
				buffer[cnt]    |= (pixel & 0x01) ? mask : 0;
				buffer[cnt+32] |= (pixel & 0x02) ? mask : 0;
				buffer[cnt+64] |= (pixel & 0x04) ? mask : 0;
				buffer[cnt+96] |= (pixel & 0x08) ? mask : 0;
			}

			/* left column */
			for (j = 0; j < 8; j++) {
				pixel = ptr[j ^ 0x07];
				mask  = 1 << j;
				buffer[cnt+1]  |= (pixel & 0x01) ? mask : 0;
				buffer[cnt+33] |= (pixel & 0x02) ? mask : 0;
				buffer[cnt+65] |= (pixel & 0x04) ? mask : 0;
				buffer[cnt+97] |= (pixel & 0x08) ? mask : 0;
			}				
			ptr += line_offset;
			cnt += 2;
		}
		break;

	case PACKED_TILE:
		/* 4-bit packed format - from array */
		cnt = 0;
		packed = (unsigned int *)data;
	
		for (i = 0; i < 16; i++) {
			/* left column */
			pixel = packed[cnt];
	
			for (j = 0; j < 8; j++) {
				mask = 1 << j;
				buffer[cnt+1]  |= (pixel & 0x01) ? mask : 0;
				buffer[cnt+33] |= (pixel & 0x02) ? mask : 0;
				buffer[cnt+65] |= (pixel & 0x04) ? mask : 0;
				buffer[cnt+97] |= (pixel & 0x08) ? mask : 0;
				pixel >>= 4;
			}

			/* right column */
			pixel = packed[cnt + 1];
	
			for (j = 0; j < 8; j++) {
				mask = 1 << j;
				buffer[cnt]    |= (pixel & 0x01) ? mask : 0;
				buffer[cnt+32] |= (pixel & 0x02) ? mask : 0;
				buffer[cnt+64] |= (pixel & 0x04) ? mask : 0;
				buffer[cnt+96] |= (pixel & 0x08) ? mask : 0;
				pixel >>= 4;
			}
			cnt += 2;
		}
		break;

	default:
		/* other formats not supported */
		error("Internal error: unsupported format passed to 'pack_16x16_sprite'!");
		break;
	}

	/* ok */
	return (128);
}